

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O2

int __thiscall MemFile::open(MemFile *this,char *__file,int __oflag,...)

{
  char cVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  FILE *pFVar7;
  size_t sVar8;
  unzFile file;
  long lVar9;
  uLong __n;
  exception *peVar10;
  uint8_t *puVar11;
  undefined8 uVar12;
  posix_error *ppVar13;
  int *piVar14;
  ulong uVar15;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  MEMORY mem;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zbuf;
  string filename;
  int nRet;
  undefined4 uStack_4f4;
  ulong uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  char *pcStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  gz_header header;
  unz_file_info sInfo;
  char szFile [512];
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
  mem.size = 0x10000001;
  mem.pb = AllocMem(0x10000001);
  pcVar6 = (char *)zlibVersion();
  cVar1 = *pcVar6;
  if ((cVar1 == '1' & (byte)__oflag) == 1) {
    pFVar7 = fopen64(*(char **)__file,"rb");
    if (pFVar7 == (FILE *)0x0) {
      ppVar13 = (posix_error *)__cxa_allocate_exception(0x20);
      piVar14 = __errno_location();
      posix_error::posix_error(ppVar13,*piVar14,*(char **)__file);
      __cxa_throw(ppVar13,&posix_error::typeinfo,std::system_error::~system_error);
    }
    sVar8 = fread(mem.pb,1,2,pFVar7);
    if (sVar8 == 0) {
      mem.pb[1] = '\0';
      *mem.pb = '\0';
    }
    fclose(pFVar7);
    if (*mem.pb == '\x1f') {
      if (mem.pb[1] == 0x8b) {
        lVar9 = gzopen64(*(undefined8 *)__file,"rb");
        if (lVar9 == 0) {
          ppVar13 = (posix_error *)__cxa_allocate_exception(0x20);
          piVar14 = __errno_location();
          posix_error::posix_error(ppVar13,*piVar14,*(char **)__file);
          __cxa_throw(ppVar13,&posix_error::typeinfo,std::system_error::~system_error);
        }
        iVar4 = gzread(lVar9,mem.pb,mem.size);
        iVar5 = gzdirect(lVar9);
        this->m_compress = (uint)(iVar5 == 0) * 2;
        gzclose(lVar9);
        __n = (uLong)iVar4;
        if (this->m_compress == Gzip) {
          std::ifstream::ifstream(szFile,*(char **)__file,_S_bin);
          __first._8_8_ = 0xffffffffffffffff;
          __first._M_sbuf = *(streambuf_type **)(szFile + *(long *)(szFile._0_8_ + -0x18) + 0xe8);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&zbuf,__first,
                     (istreambuf_iterator<char,_std::char_traits<char>_>)
                     (ZEXT816(0xffffffff) << 0x40),(allocator_type *)&sInfo);
          local_4e8 = 0;
          local_4d8 = 0;
          local_4a0 = 0;
          uStack_498 = 0;
          uStack_4b0 = 0;
          uStack_4a8 = 0;
          local_490 = 0;
          uStack_4c0 = 0;
          local_4b8 = 0;
          pcStack_4d0 = (char *)0x0;
          local_4c8 = 0;
          _nRet = CONCAT44(zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)zbuf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          uStack_4f0 = (ulong)(uint)((int)zbuf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (int)zbuf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          uStack_4e0 = _nRet;
          iVar4 = inflateInit2_(&nRet,0x1f,"1.2.11",0x70);
          if (iVar4 == 0) {
            memset(&sInfo,0,0x200);
            header.extra_len = 0;
            header.extra_max = 0;
            header.comment = (Bytef *)0x0;
            header.comm_max = 0;
            header.hcrc = 0;
            header.done = 0;
            header._76_4_ = 0;
            header.xflags = 0;
            header.os = 0;
            header.extra = (Bytef *)0x0;
            header.text = 0;
            header._4_4_ = 0;
            header.time = 0;
            header.name_max = 0x200;
            header._52_4_ = 0;
            header.name = (Bytef *)&sInfo;
            inflateGetHeader(&nRet);
            iVar4 = inflate(&nRet,0);
            if ((iVar4 == 0) && ((char)sInfo.version != '\0')) {
              std::__cxx11::string::assign((char *)&filename);
            }
            inflateEnd(&nRet);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::ifstream::~ifstream(szFile);
        }
        goto LAB_0016d0be;
      }
      goto LAB_0016d0c8;
    }
    if ((*mem.pb != 'P') || (mem.pb[1] != 'K')) goto LAB_0016d0c8;
    file = unzOpen(*(char **)__file);
    if (file == (unzFile)0x0) {
      peVar10 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[13]>(peVar10,(char (*) [13])"bad zip file");
      __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = unzGoToFirstFile(file);
    uVar15 = 0;
    while (_nRet = CONCAT44(uStack_4f4,uVar3), uVar3 == 0) {
      unzGetCurrentFileInfo(file,&sInfo,szFile,0x200,(void *)0x0,0,(char *)0x0,0);
      if (sInfo.uncompressed_size != 0) {
        iVar4 = GetFileType(szFile);
        if (iVar4 != 0) {
          iVar4 = unzOpenCurrentFile(file);
          if (iVar4 == 0) {
            uVar3 = unzReadCurrentFile(file,mem.pb,mem.size);
            _nRet = CONCAT44(uStack_4f4,uVar3);
            unzCloseCurrentFile(file);
            std::__cxx11::string::assign((char *)&filename);
            break;
          }
        }
        if (uVar15 < sInfo.uncompressed_size) {
          uVar15 = sInfo.uncompressed_size;
        }
      }
      uVar3 = unzGoToNextFile(file);
    }
    if (uVar3 == 0xffffff9c) {
      uVar3 = unzGoToFirstFile(file);
      while (_nRet = CONCAT44(uStack_4f4,uVar3), uVar3 == 0) {
        unzGetCurrentFileInfo(file,&sInfo,(char *)0x0,0,(void *)0x0,0,(char *)0x0,0);
        if (sInfo.uncompressed_size == uVar15) {
          iVar4 = unzOpenCurrentFile(file);
          if (iVar4 == 0) {
            uVar3 = unzReadCurrentFile(file,mem.pb,mem.size);
            _nRet = CONCAT44(uStack_4f4,uVar3);
            unzCloseCurrentFile(file);
            break;
          }
        }
        uVar3 = unzGoToNextFile(file);
      }
    }
    unzClose(file);
    if ((int)uVar3 < 0) {
      peVar10 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[24],int&,char_const(&)[2]>
                (peVar10,(char (*) [24])"zip extraction failed (",&nRet,(char (*) [2])0x1a9e10);
      __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    __n = (uLong)uVar3;
    this->m_compress = Zip;
LAB_0016d0be:
    if (__n == 0) goto LAB_0016d0c8;
  }
  else {
LAB_0016d0c8:
    pFVar7 = fopen64(*(char **)__file,"rb");
    if (pFVar7 == (FILE *)0x0) {
      ppVar13 = (posix_error *)__cxa_allocate_exception(0x20);
      piVar14 = __errno_location();
      posix_error::posix_error(ppVar13,*piVar14,*(char **)__file);
      __cxa_throw(ppVar13,&posix_error::typeinfo,std::system_error::~system_error);
    }
    __n = fread(mem.pb,1,(long)mem.size,pFVar7);
    fclose(pFVar7);
    this->m_compress = None;
  }
  if ((byte)__oflag != 0) {
    uVar2 = *mem.pb;
    if (uVar2 == '\x1f') {
      if (mem.pb[1] == 0x8b) {
        if (cVar1 != '1') {
          peVar10 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[48]>
                    (peVar10,(char (*) [48])"zlib support is not available for gzipped files");
          goto LAB_0016d453;
        }
        header._0_8_ = &PTR__MEMORY_001dcd38;
        header.time = CONCAT44(header.time._4_4_,0x10000001);
        header._16_8_ = AllocMem(0x10000001);
        sInfo.flag = 0;
        sInfo.disk_num_start = 0;
        sInfo.internal_fa = 0;
        sInfo.size_file_extra = 0;
        sInfo.size_file_comment = 0;
        sInfo.external_fa = 0;
        sInfo.uncompressed_size = 0;
        sInfo.size_filename = 0;
        sInfo.crc = 0;
        sInfo.compressed_size = 0;
        sInfo.version = (uLong)mem.pb;
        sInfo.version_needed = __n & 0xffffffff;
        sInfo.dosDate = header.time & 0xffffffff;
        sInfo.compression_method = header._16_8_;
        iVar4 = inflateInit2_(&sInfo,0x1f,"1.2.11",0x70);
        zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = iVar4;
        if (iVar4 == 0) {
          memset(szFile,0,0x200);
          local_4d8 = 0;
          uStack_4c0 = 0;
          local_4b8 = 0;
          uStack_4b0 = 0;
          local_4e8 = 0;
          uStack_4e0 = 0;
          _nRet = 0;
          uStack_4f0 = 0;
          local_4c8 = 0x200;
          pcStack_4d0 = szFile;
          inflateGetHeader(&sInfo);
          iVar4 = inflate(&sInfo,4);
          zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = iVar4;
          if ((iVar4 == 1) && (szFile[0] != '\0')) {
            std::__cxx11::string::assign((char *)&filename);
          }
          inflateEnd(&sInfo);
        }
        __n = sInfo.crc;
        if (iVar4 != 1) {
          peVar10 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[28],int&,char_const(&)[2]>
                    (peVar10,(char (*) [28])"gzip decompression failed (",(int *)&zbuf,
                     (char (*) [2])0x1a9e10);
          __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        memcpy(mem.pb,(void *)header._16_8_,sInfo.crc);
        this->m_compress = Zip;
        MEMORY::~MEMORY((MEMORY *)&header);
        uVar2 = *mem.pb;
        goto LAB_0016d2d7;
      }
    }
    else if (uVar2 == 'P') {
      if (mem.pb[1] == 'K') {
        peVar10 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[47]>
                  (peVar10,(char (*) [47])"zlib support is not available for zipped files");
        goto LAB_0016d453;
      }
    }
    else {
LAB_0016d2d7:
      if ((uVar2 == 'B') && (mem.pb[1] == 'Z')) {
        peVar10 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[31]>
                  (peVar10,(char (*) [31])"bzip2 support is not available");
        goto LAB_0016d453;
      }
    }
    if (6 < mem.size) {
      iVar4 = bcmp(mem.pb,anon_var_dwarf_1a025f,6);
      if (iVar4 == 0) {
        sInfo.version = (uLong)&PTR__MEMORY_001dcd38;
        sInfo.version_needed = CONCAT44(sInfo.version_needed._4_4_,0x10000001);
        puVar11 = AllocMem(0x10000001);
        sInfo.flag = (uLong)puVar11;
        memset(szFile,0,0x88);
        iVar4 = lzma_stream_decoder(szFile,0xffffffffffffffff,2);
        _nRet = CONCAT44(uStack_4f4,iVar4);
        if (iVar4 != 0) {
LAB_0016d4e3:
          peVar10 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[26],lzma_ret&,char_const(&)[2]>
                    (peVar10,(char (*) [26])"xz decompression failed (",(lzma_ret *)&nRet,
                     (char (*) [2])0x1a9e10);
          __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        szFile._0_8_ = mem.pb;
        szFile._8_8_ = SEXT48(mem.size);
        szFile[0x20] = '\x01';
        szFile[0x21] = '\0';
        szFile[0x22] = '\0';
        szFile[0x23] = '\x10';
        szFile[0x24] = '\0';
        szFile[0x25] = '\0';
        szFile[0x26] = '\0';
        szFile[0x27] = '\0';
        szFile._24_8_ = puVar11;
        iVar4 = lzma_code(szFile,3);
        _nRet = CONCAT44(uStack_4f4,iVar4);
        if (iVar4 != 0) {
          if (iVar4 != 1) goto LAB_0016d4e3;
          __n = (long)(int)sInfo.version_needed - szFile._32_8_;
          memcpy(mem.pb,(void *)sInfo.flag,__n);
          this->m_compress = Xz;
        }
        MEMORY::~MEMORY((MEMORY *)&sInfo);
      }
    }
  }
  if (__n < 0x10000001) {
    open(this,(char *)mem.pb,(int)__n,__file,&filename);
    MEMORY::~MEMORY(&mem);
    uVar12 = std::__cxx11::string::~string((string *)&filename);
    return (int)CONCAT71((int7)((ulong)uVar12 >> 8),1);
  }
  peVar10 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[18]>(peVar10,(char (*) [18])"file size too big");
LAB_0016d453:
  __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool MemFile::open(const std::string& path_, bool uncompress)
{
    std::string filename;
    MEMORY mem(MAX_IMAGE_SIZE + 1);
    size_t uRead = 0;

    // Check if zlib is available
#ifndef HAVE_ZLIB
    bool have_zlib = false;
#else
    bool have_zlib = zlibVersion()[0] == ZLIB_VERSION[0];

    // Read start of file to check for compression signatures.
    if (uncompress && have_zlib)
    {
        FILE* f = fopen(path_.c_str(), "rb");
        if (!f)
            throw posix_error(errno, path_.c_str());

        if (!fread(mem, 1, 2, f))
            mem[0] = mem[1] = '\0';

        fclose(f);
    }

    if (uncompress && have_zlib)
    {
        // Require zip file header magic.
        if (mem[0U] == 'P' && mem[1U] == 'K')
        {
            unzFile hfZip = unzOpen(path_.c_str());
            if (!hfZip)
                throw util::exception("bad zip file");

            int nRet;
            unz_file_info sInfo;
            uLong ulMaxSize = 0;

            // Iterate through the contents of the zip looking for a file with a suitable size
            for (nRet = unzGoToFirstFile(hfZip); nRet == UNZ_OK; nRet = unzGoToNextFile(hfZip))
            {
                char szFile[MAX_PATH];

                // Get details of the current file
                unzGetCurrentFileInfo(hfZip, &sInfo, szFile, MAX_PATH, nullptr, 0, nullptr, 0);

                // Ignore directories and empty files
                if (!sInfo.uncompressed_size)
                    continue;

                // If the file extension is recognised, read the file contents
                // ToDo: GetFileType doesn't really belong here?
                if (GetFileType(szFile) != ftUnknown && unzOpenCurrentFile(hfZip) == UNZ_OK)
                {
                    nRet = unzReadCurrentFile(hfZip, mem, static_cast<unsigned int>(mem.size));
                    unzCloseCurrentFile(hfZip);
                    filename = szFile;
                    break;
                }

                // Rememeber the largest uncompressed file size
                if (sInfo.uncompressed_size > ulMaxSize)
                    ulMaxSize = sInfo.uncompressed_size;
            }

            // Did we fail to find a matching extension?
            if (nRet == UNZ_END_OF_LIST_OF_FILE)
            {
                // Loop back over the archive
                for (nRet = unzGoToFirstFile(hfZip); nRet == UNZ_OK; nRet = unzGoToNextFile(hfZip))
                {
                    // Get details of the current file
                    unzGetCurrentFileInfo(hfZip, &sInfo, nullptr, 0, nullptr, 0, nullptr, 0);

                    // Open the largest file found about
                    if (sInfo.uncompressed_size == ulMaxSize && unzOpenCurrentFile(hfZip) == UNZ_OK)
                    {
                        nRet = unzReadCurrentFile(hfZip, mem, static_cast<unsigned int>(mem.size));
                        unzCloseCurrentFile(hfZip);
                        break;
                    }
                }
            }

            // Close the zip archive
            unzClose(hfZip);

            if (nRet < 0)
                throw util::exception("zip extraction failed (", nRet, ")");

            uRead = nRet;
            m_compress = Compress::Zip;
        }
        // Require gzip file header magic.
        else if (mem[0U] == 0x1f && mem[1U] == 0x8b)
        {
            // Open as gzipped or uncompressed
            gzFile gf = gzopen(path_.c_str(), "rb");
            if (gf == Z_NULL)
                throw posix_error(errno, path_.c_str());

            uRead = gzread(gf, mem, static_cast<unsigned>(mem.size));
            m_compress = gzdirect(gf) ? Compress::None : Compress::Gzip;
            gzclose(gf);

            // If gzipped, attempt to extract the original filename
            if (m_compress == Compress::Gzip)
            {
                std::ifstream zs(path_.c_str(), std::ios_base::binary);
                std::vector<uint8_t> zbuf((std::istreambuf_iterator<char>(zs)),
                    std::istreambuf_iterator<char>());

                z_stream stream{};
                stream.next_in = zbuf.data();
                stream.avail_in = static_cast<uInt>(zbuf.size());
                stream.next_out = zbuf.data();  // same as next_in!
                stream.avail_out = 0;           // we don't want data

                auto zerr = inflateInit2(&stream, 16 + MAX_WBITS); // 16=gzip
                if (zerr == Z_OK)
                {
                    Bytef name[MAX_PATH]{};
                    gz_header header{};
                    header.name = name;
                    header.name_max = MAX_PATH;

                    zerr = inflateGetHeader(&stream, &header);
                    zerr = inflate(&stream, 0);
                    if (zerr == Z_OK && name[0])
                        filename = reinterpret_cast<const char*>(name);
                    inflateEnd(&stream);
                }
            }
        }
    }
#endif // HAVE_ZLIB

    // If didn't read as a compressed file, open as normal file.
    if (!uRead)
    {
        FILE* f = fopen(path_.c_str(), "rb");
        if (!f)
            throw posix_error(errno, path_.c_str());

        uRead = fread(mem, 1, mem.size, f);
        fclose(f);
        m_compress = Compress::None;
    }

    // zip compressed? (and not handled above)
    if (uncompress && mem[0U] == 'P' && mem[1U] == 'K')
        throw util::exception("zlib support is not available for zipped files");
    // gzip compressed?
    if (uncompress && mem[0U] == 0x1f && mem[1U] == 0x8b)
    {
        if (!have_zlib)
            throw util::exception("zlib support is not available for gzipped files");

        // Unknowingly gzipped image files may be zipped, so we need to handle
        // a second level of decompression here.
#ifdef HAVE_ZLIB
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        z_stream stream{};
        stream.next_in = mem.pb;
        stream.avail_in = static_cast<uInt>(uRead);
        stream.next_out = mem2.pb;
        stream.avail_out = static_cast<uInt>(mem2.size);

        auto zerr = inflateInit2(&stream, 16 + MAX_WBITS);
        if (zerr == Z_OK)
        {
            Bytef name[MAX_PATH]{};
            gz_header header{};
            header.name = name;
            header.name_max = MAX_PATH;

            zerr = inflateGetHeader(&stream, &header);
            zerr = inflate(&stream, Z_FINISH);
            if (zerr == Z_STREAM_END && name[0])
                filename = reinterpret_cast<const char*>(name);
            inflateEnd(&stream);
        }

        if (zerr != Z_STREAM_END)
            throw util::exception("gzip decompression failed (", zerr, ")");

        memcpy(mem.pb, mem2.pb, uRead = stream.total_out);
        m_compress = Compress::Zip;
#endif
    }

    // bzip2 compressed?
    if (uncompress && mem[0U] == 'B' && mem[1U] == 'Z')
    {
#ifndef HAVE_BZIP2
        throw util::exception("bzip2 support is not available");
#else
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        auto uBzRead = static_cast<unsigned>(mem2.size);
        auto bzerr = BZ2_bzBuffToBuffDecompress(
            reinterpret_cast<char*>(mem2.pb), &uBzRead,
            reinterpret_cast<char*>(mem.pb), static_cast<int>(uRead), 0, 0);
        if (bzerr != BZ_OK)
            throw util::exception("bzip2 decompression failed (", bzerr, ")");

        memcpy(mem.pb, mem2.pb, uRead = uBzRead);
        m_compress = Compress::Bzip2;
#endif // HAVE_BZIP2
    }

    if (uncompress && mem.size > 6 && !memcmp(mem.pb, "\xfd\x37\x7a\x58\x5a\x00", 6))
    {
#ifndef HAVE_LZMA
        throw util::exception("lzma support is not available");
#else
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        lzma_stream strm{};
        const uint32_t flags = LZMA_TELL_UNSUPPORTED_CHECK;
        auto ret = lzma_stream_decoder(&strm, UINT64_MAX, flags);
        if (ret == LZMA_OK)
        {
            strm.next_in = mem.pb;
            strm.avail_in = mem.size;
            strm.next_out = mem2.pb;
            strm.avail_out = mem2.size;

            ret = lzma_code(&strm, LZMA_FINISH);
            if (ret == LZMA_STREAM_END)
            {
                uRead = mem2.size - strm.avail_out;
                memcpy(mem.pb, mem2.pb, uRead);
                m_compress = Compress::Xz;
                ret = LZMA_OK;
            }
        }

        if (ret != LZMA_OK)
            throw util::exception("xz decompression failed (", ret, ")");
#endif
    }

    if (uRead <= MAX_IMAGE_SIZE)
        return open(mem.pb, static_cast<int>(uRead), path_, filename);

    throw util::exception("file size too big");
}